

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeProduct::~IfcTypeProduct(IfcTypeProduct *this)

{
  ~IfcTypeProduct((IfcTypeProduct *)
                  (&(this->super_IfcTypeObject).field_0x0 +
                  *(long *)(*(long *)&this->super_IfcTypeObject + -0x18)));
  return;
}

Assistant:

IfcTypeProduct() : Object("IfcTypeProduct") {}